

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# datapiece.cc
# Opt level: O2

StatusOr<unsigned_int> * __thiscall
google::protobuf::util::converter::(anonymous_namespace)::
ValidateNumberConversion<unsigned_int,double>
          (StatusOr<unsigned_int> *__return_storage_ptr__,_anonymous_namespace_ *this,uint after,
          double before)

{
  char *pcVar1;
  undefined *in_RCX;
  double dVar2;
  double dVar3;
  StringPiece value_str;
  string local_70;
  undefined1 local_50 [44];
  uint local_24 [2];
  uint after_local;
  
  local_24[0] = (uint)this;
  if (((double)((ulong)this & 0xffffffff) == before) &&
     (!NAN((double)((ulong)this & 0xffffffff)) && !NAN(before))) {
    dVar2 = 0.0;
    in_RCX = (undefined *)CONCAT71((int7)((ulong)in_RCX >> 8),0.0 < before);
    dVar3 = before;
    if (before != 0.0) {
      in_RCX = &DAT_0036c5b0;
      dVar3 = *(double *)(&DAT_0036c5b0 + (ulong)(0.0 < before) * 8);
    }
    if (local_24[0] != 0) {
      dVar2 = 1.0;
    }
    if ((dVar3 == dVar2) && (!NAN(dVar3) && !NAN(dVar2))) {
      StatusOr<unsigned_int>::StatusOr(__return_storage_ptr__,local_24);
      return __return_storage_ptr__;
    }
  }
  DoubleAsString_abi_cxx11_(&local_70,(converter *)this,before);
  pcVar1 = (char *)StringPiece::CheckedSsizeTFromSizeT(local_70._M_string_length);
  value_str.length_ = (stringpiece_ssize_type)in_RCX;
  value_str.ptr_ = pcVar1;
  anon_unknown_1::InvalidArgument
            ((Status *)local_50,(anon_unknown_1 *)local_70._M_dataplus._M_p,value_str);
  StatusOr<unsigned_int>::StatusOr(__return_storage_ptr__,(Status *)local_50);
  std::__cxx11::string::~string((string *)(local_50 + 8));
  std::__cxx11::string::~string((string *)&local_70);
  return __return_storage_ptr__;
}

Assistant:

StatusOr<To> ValidateNumberConversion(To after, From before) {
  if (after == before &&
      MathUtil::Sign<From>(before) == MathUtil::Sign<To>(after)) {
    return after;
  } else {
    return InvalidArgument(std::is_integral<From>::value
                               ? ValueAsString(before)
                               : std::is_same<From, double>::value
                                     ? DoubleAsString(before)
                                     : FloatAsString(before));
  }
}